

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O2

void Ivy_GraphUpdateNetworkSeq(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Dec_Graph_t *pGraph,int nGain)

{
  int iVar1;
  int iVar2;
  Dec_Edge_t DVar3;
  Dec_Node_t *pDVar4;
  void *pvVar5;
  uint uVar6;
  Ivy_Obj_t *pIVar7;
  ulong uVar8;
  Ivy_Obj_t *p1;
  Dec_Node_t *pDVar9;
  uint uVar10;
  
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  if (pGraph->fConst == 0) {
    uVar8 = (ulong)(uint)pGraph->nLeaves;
    uVar6 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    if (uVar6 < (uint)pGraph->nLeaves) {
      pDVar9 = pGraph->pNodes;
      pIVar7 = (Ivy_Obj_t *)pDVar9[uVar6].field_2.pFunc;
      for (uVar10 = 0; uVar10 < *(uint *)&pDVar9[uVar6].field_0x10 >> 0x1b; uVar10 = uVar10 + 1) {
        pIVar7 = Ivy_Latch(p,pIVar7,IVY_INIT_DC);
        pDVar9[uVar6].field_2.pFunc = pIVar7;
      }
    }
    else {
      pDVar9 = (Dec_Node_t *)0x0;
      for (; (long)uVar8 < (long)pGraph->nSize; uVar8 = uVar8 + 1) {
        pDVar4 = pGraph->pNodes;
        pDVar9 = pDVar4 + uVar8;
        pIVar7 = (Ivy_Obj_t *)
                 ((ulong)((uint)pDVar4[uVar8].eEdge0 & 1) ^
                 (ulong)pDVar4[(uint)pDVar4[uVar8].eEdge0 >> 1 & 0x3fffffff].field_2.pFunc);
        DVar3 = pDVar4[uVar8].eEdge1;
        pvVar5 = pDVar4[(uint)DVar3 >> 1 & 0x3fffffff].field_2.pFunc;
        for (uVar6 = 0; uVar10 = *(uint *)&pDVar9->field_0x10, uVar6 < (uVar10 >> 0x11 & 0x1f);
            uVar6 = uVar6 + 1) {
          pIVar7 = Ivy_Latch(p,pIVar7,IVY_INIT_DC);
        }
        p1 = (Ivy_Obj_t *)((ulong)((uint)DVar3 & 1) ^ (ulong)pvVar5);
        for (uVar6 = 0; uVar6 < (uVar10 >> 0x16 & 0x1f); uVar6 = uVar6 + 1) {
          p1 = Ivy_Latch(p,p1,IVY_INIT_DC);
          uVar10 = *(uint *)&pDVar9->field_0x10;
        }
        pIVar7 = Ivy_And(p,pIVar7,p1);
        (pDVar9->field_2).pFunc = pIVar7;
      }
      pIVar7 = (Ivy_Obj_t *)(pDVar9->field_2).pFunc;
      for (uVar6 = 0; uVar6 < *(uint *)&pDVar9->field_0x10 >> 0x1b; uVar6 = uVar6 + 1) {
        pIVar7 = Ivy_Latch(p,pIVar7,IVY_INIT_DC);
        (pDVar9->field_2).pFunc = pIVar7;
      }
    }
  }
  else {
    pIVar7 = p->pConst1;
  }
  Ivy_ObjReplace(p,pRoot,(Ivy_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pIVar7),1,0,0);
  if ((iVar2 + iVar1) - (p->nObjs[5] + p->nObjs[6]) < nGain) {
    __assert_fail("nGain <= nNodesOld - nNodesNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivySeq.c"
                  ,0x218,
                  "void Ivy_GraphUpdateNetworkSeq(Ivy_Man_t *, Ivy_Obj_t *, Dec_Graph_t *, int)");
  }
  Ivy_ManPropagateBuffers(p,0);
  return;
}

Assistant:

void Ivy_GraphUpdateNetworkSeq( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Dec_Graph_t * pGraph, int nGain )
{
    Ivy_Obj_t * pRootNew;
    int nNodesNew, nNodesOld;
    nNodesOld = Ivy_ManNodeNum(p);
    // create the new structure of nodes
    pRootNew = Ivy_GraphToNetworkSeq( p, pGraph );
    Ivy_ObjReplace( p, pRoot, pRootNew, 1, 0, 0 );
    // compare the gains
    nNodesNew = Ivy_ManNodeNum(p);
    assert( nGain <= nNodesOld - nNodesNew );
    // propagate the buffer
    Ivy_ManPropagateBuffers( p, 0 );
}